

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeDrawList
               (ImGuiWindow *window,ImGuiViewportP *viewport,ImDrawList *draw_list,char *label)

{
  ImDrawListFlags IVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ImDrawCmd *pIVar6;
  ImDrawList *pIVar7;
  ImDrawCmd *pIVar8;
  long lVar9;
  void **lhs;
  float fVar10;
  char *local_330;
  uint local_314;
  ImVec2 *local_2f8;
  uint local_2d4;
  ImVec2 *local_2b8;
  long local_2b0;
  ImDrawList *local_290;
  char *local_280;
  ImDrawListFlags backup_flags;
  float *local_258;
  ImDrawVert *v;
  int n_1;
  ImVec2 triangle_1 [3];
  char *buf_end;
  char *buf_p;
  int local_210;
  int idx_i;
  int prim;
  undefined1 local_200 [8];
  ImGuiListClipper clipper;
  int local_1dc;
  int n;
  ImVec2 triangle [3];
  uint local_1b8;
  float local_1b4;
  uint idx_n;
  float total_area;
  ImDrawVert *vtx_buffer;
  ImDrawIdx *idx_buffer;
  char local_198 [7];
  bool pcmd_node_open;
  char buf [300];
  ImDrawCmd *pcmd;
  ImDrawList *local_58;
  ImDrawList *fg_draw_list;
  byte local_3d;
  int local_3c;
  bool node_open;
  ImGuiMetricsConfig *pIStack_38;
  int cmd_count;
  ImGuiMetricsConfig *cfg;
  ImGuiContext *g;
  char *label_local;
  ImDrawList *draw_list_local;
  ImGuiViewportP *viewport_local;
  ImGuiWindow *window_local;
  
  cfg = (ImGuiMetricsConfig *)GImGui;
  pIStack_38 = &GImGui->DebugMetricsConfig;
  local_3c = (draw_list->CmdBuffer).Size;
  g = (ImGuiContext *)label;
  label_local = (char *)draw_list;
  draw_list_local = (ImDrawList *)viewport;
  viewport_local = (ImGuiViewportP *)window;
  if (((0 < local_3c) &&
      (pIVar6 = ImVector<ImDrawCmd>::back(&draw_list->CmdBuffer), pIVar6->ElemCount == 0)) &&
     (pIVar6 = ImVector<ImDrawCmd>::back((ImVector<ImDrawCmd> *)label_local),
     pIVar6->UserCallback == (ImDrawCallback)0x0)) {
    local_3c = local_3c + -1;
  }
  if (*(long *)(label_local + 0x40) == 0) {
    local_280 = "";
  }
  else {
    local_280 = *(char **)(label_local + 0x40);
  }
  local_3d = TreeNode(label_local,"%s: \'%s\' %d vtx, %d indices, %d cmds",g,local_280,
                      (ulong)*(uint *)(label_local + 0x20),(ulong)*(uint *)(label_local + 0x10),
                      local_3c);
  pcVar2 = label_local;
  pIVar7 = GetWindowDrawList();
  if ((ImDrawList *)pcVar2 == pIVar7) {
    SameLine(0.0,-1.0);
    ImVec4::ImVec4((ImVec4 *)&fg_draw_list,1.0,0.4,0.4,1.0);
    TextColored((ImVec4 *)&fg_draw_list,"CURRENTLY APPENDING");
    if ((local_3d & 1) != 0) {
      TreePop();
    }
  }
  else {
    if (draw_list_local == (ImDrawList *)0x0) {
      local_290 = (ImDrawList *)0x0;
    }
    else {
      local_290 = GetForegroundDrawList((ImGuiViewport *)draw_list_local);
    }
    local_58 = local_290;
    if (((viewport_local != (ImGuiViewportP *)0x0) && (local_290 != (ImDrawList *)0x0)) &&
       (bVar3 = IsItemHovered(0), pIVar7 = local_58, bVar3)) {
      lhs = &(viewport_local->super_ImGuiViewport).PlatformHandle;
      pcmd = (ImDrawCmd *)
             operator+((ImVec2 *)lhs,
                       (ImVec2 *)&(viewport_local->super_ImGuiViewport).PlatformHandleRaw);
      ImDrawList::AddRect(pIVar7,(ImVec2 *)lhs,(ImVec2 *)&pcmd,0xff00ffff,0.0,0,1.0);
    }
    if ((local_3d & 1) != 0) {
      if ((viewport_local != (ImGuiViewportP *)0x0) &&
         (((uint)(viewport_local->DrawDataP).FramebufferScale.x & 1) == 0)) {
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");
      }
      for (unique0x00012000 = *(ImDrawCmd **)(label_local + 8);
          stack0xffffffffffffff98 <
          (ImDrawCmd *)(*(long *)(label_local + 8) + (long)local_3c * 0x38);
          register0x00000000 = stack0xffffffffffffff98 + 1) {
        if (stack0xffffffffffffff98->UserCallback == (ImDrawCallback)0x0) {
          ImFormatString(local_198,300,
                         "DrawCmd:%5d tris, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                         (double)(stack0xffffffffffffff98->ClipRect).x,
                         (double)(stack0xffffffffffffff98->ClipRect).y,
                         (double)(stack0xffffffffffffff98->ClipRect).z,
                         (double)(stack0xffffffffffffff98->ClipRect).w,
                         (ulong)stack0xffffffffffffff98->ElemCount / 3,
                         stack0xffffffffffffff98->TextureId);
          pIVar6 = stack0xffffffffffffff98;
          pIVar8 = ImVector<ImDrawCmd>::begin((ImVector<ImDrawCmd> *)label_local);
          bVar3 = TreeNode((void *)(((long)pIVar6 - (long)pIVar8) / 0x38),"%s",local_198);
          bVar4 = IsItemHovered(0);
          if ((bVar4) &&
             ((((pIStack_38->ShowDrawCmdMesh & 1U) != 0 ||
               ((pIStack_38->ShowDrawCmdBoundingBoxes & 1U) != 0)) &&
              (local_58 != (ImDrawList *)0x0)))) {
            DebugNodeDrawCmdShowMeshAndBoundingBox
                      (local_58,(ImDrawList *)label_local,stack0xffffffffffffff98,
                       (bool)(pIStack_38->ShowDrawCmdMesh & 1),
                       (bool)(pIStack_38->ShowDrawCmdBoundingBoxes & 1));
          }
          if (bVar3) {
            if (*(int *)(label_local + 0x10) < 1) {
              local_2b0 = 0;
            }
            else {
              local_2b0 = *(long *)(label_local + 0x18);
            }
            lVar9 = *(long *)(label_local + 0x28) + (ulong)stack0xffffffffffffff98->VtxOffset * 0x14
            ;
            local_1b4 = 0.0;
            local_1b8 = stack0xffffffffffffff98->IdxOffset;
            while (local_1b8 <
                   stack0xffffffffffffff98->IdxOffset + stack0xffffffffffffff98->ElemCount) {
              local_2b8 = (ImVec2 *)&stack0xfffffffffffffe28;
              do {
                ImVec2::ImVec2(local_2b8);
                local_2b8 = local_2b8 + 1;
              } while (local_2b8 != triangle + 2);
              for (local_1dc = 0; local_1dc < 3; local_1dc = local_1dc + 1) {
                if (local_2b0 == 0) {
                  local_2d4 = local_1b8;
                }
                else {
                  local_2d4 = (uint)*(ushort *)(local_2b0 + (ulong)local_1b8 * 2);
                }
                *(undefined8 *)(&stack0xfffffffffffffe28 + (long)local_1dc * 8) =
                     *(undefined8 *)(lVar9 + (ulong)local_2d4 * 0x14);
                local_1b8 = local_1b8 + 1;
              }
              fVar10 = ImTriangleArea((ImVec2 *)&stack0xfffffffffffffe28,triangle,triangle + 1);
              local_1b4 = fVar10 + local_1b4;
            }
            ImFormatString(local_198,300,
                           "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px",
                           (double)local_1b4,(ulong)stack0xffffffffffffff98->ElemCount,
                           (ulong)stack0xffffffffffffff98->VtxOffset,
                           (ulong)stack0xffffffffffffff98->IdxOffset);
            ImVec2::ImVec2((ImVec2 *)&clipper.ItemsHeight,0.0,0.0);
            Selectable(local_198,false,0,(ImVec2 *)&clipper.ItemsHeight);
            bVar3 = IsItemHovered(0);
            if ((bVar3) && (local_58 != (ImDrawList *)0x0)) {
              DebugNodeDrawCmdShowMeshAndBoundingBox
                        (local_58,(ImDrawList *)label_local,stack0xffffffffffffff98,true,false);
            }
            ImGuiListClipper::ImGuiListClipper((ImGuiListClipper *)local_200);
            ImGuiListClipper::Begin
                      ((ImGuiListClipper *)local_200,stack0xffffffffffffff98->ElemCount / 3,-1.0);
            while (bVar3 = ImGuiListClipper::Step((ImGuiListClipper *)local_200), bVar3) {
              local_210 = local_200._0_4_;
              buf_p._4_4_ = stack0xffffffffffffff98->IdxOffset + local_200._0_4_ * 3;
              for (; local_210 < (int)local_200._4_4_; local_210 = local_210 + 1) {
                buf_end = local_198;
                local_2f8 = (ImVec2 *)&stack0xfffffffffffffdb8;
                do {
                  ImVec2::ImVec2(local_2f8);
                  local_2f8 = local_2f8 + 1;
                } while (local_2f8 != triangle_1 + 2);
                for (v._4_4_ = 0; v._4_4_ < 3; v._4_4_ = v._4_4_ + 1) {
                  if (local_2b0 == 0) {
                    local_314 = buf_p._4_4_;
                  }
                  else {
                    local_314 = (uint)*(ushort *)(local_2b0 + (long)(int)buf_p._4_4_ * 2);
                  }
                  local_258 = (float *)(lVar9 + (long)(int)local_314 * 0x14);
                  *(undefined8 *)(&stack0xfffffffffffffdb8 + (long)v._4_4_ * 8) =
                       *(undefined8 *)local_258;
                  if (v._4_4_ == 0) {
                    local_330 = "Vert:";
                  }
                  else {
                    local_330 = "     ";
                  }
                  iVar5 = ImFormatString(buf_end,(size_t)(buf + (0x124 - (long)buf_end)),
                                         "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                         (double)*local_258,(double)local_258[1],
                                         (double)local_258[2],(double)local_258[3],local_330,
                                         (ulong)buf_p._4_4_,(ulong)(uint)local_258[4]);
                  buf_end = buf_end + iVar5;
                  buf_p._4_4_ = buf_p._4_4_ + 1;
                }
                ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffda0,0.0,0.0);
                Selectable(local_198,false,0,(ImVec2 *)&stack0xfffffffffffffda0);
                if ((local_58 != (ImDrawList *)0x0) && (bVar3 = IsItemHovered(0), bVar3)) {
                  IVar1 = local_58->Flags;
                  local_58->Flags = local_58->Flags & 0xfffffffe;
                  ImDrawList::AddPolyline
                            (local_58,(ImVec2 *)&stack0xfffffffffffffdb8,3,0xff00ffff,1,1.0);
                  local_58->Flags = IVar1;
                }
              }
            }
            TreePop();
            ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)local_200);
          }
        }
        else {
          BulletText("Callback %p, user_data %p",stack0xffffffffffffff98->UserCallback,
                     stack0xffffffffffffff98->UserCallbackData);
        }
      }
      TreePop();
    }
  }
  return;
}

Assistant:

void ImGui::DebugNodeDrawList(ImGuiWindow* window, ImGuiViewportP* viewport, const ImDrawList* draw_list, const char* label)
{
    ImGuiContext& g = *GImGui;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;
    int cmd_count = draw_list->CmdBuffer.Size;
    if (cmd_count > 0 && draw_list->CmdBuffer.back().ElemCount == 0 && draw_list->CmdBuffer.back().UserCallback == NULL)
        cmd_count--;
    bool node_open = TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, cmd_count);
    if (draw_list == GetWindowDrawList())
    {
        SameLine();
        TextColored(ImVec4(1.0f, 0.4f, 0.4f, 1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
        if (node_open)
            TreePop();
        return;
    }

    ImDrawList* fg_draw_list = viewport ? GetForegroundDrawList(viewport) : NULL; // Render additional visuals into the top-most draw list
    if (window && fg_draw_list && IsItemHovered())
        fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!node_open)
        return;

    if (window && !window->WasActive)
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

    for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.Data; pcmd < draw_list->CmdBuffer.Data + cmd_count; pcmd++)
    {
        if (pcmd->UserCallback)
        {
            BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
            continue;
        }

        char buf[300];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd:%5d tris, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
            pcmd->ElemCount / 3, (void*)(intptr_t)pcmd->TextureId,
            pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
        bool pcmd_node_open = TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
        if (IsItemHovered() && (cfg->ShowDrawCmdMesh || cfg->ShowDrawCmdBoundingBoxes) && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, cfg->ShowDrawCmdMesh, cfg->ShowDrawCmdBoundingBoxes);
        if (!pcmd_node_open)
            continue;

        // Calculate approximate coverage area (touched pixel count)
        // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
        const ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
        const ImDrawVert* vtx_buffer = draw_list->VtxBuffer.Data + pcmd->VtxOffset;
        float total_area = 0.0f;
        for (unsigned int idx_n = pcmd->IdxOffset; idx_n < pcmd->IdxOffset + pcmd->ElemCount; )
        {
            ImVec2 triangle[3];
            for (int n = 0; n < 3; n++, idx_n++)
                triangle[n] = vtx_buffer[idx_buffer ? idx_buffer[idx_n] : idx_n].pos;
            total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
        }

        // Display vertex information summary. Hover to get all triangles drawn in wire-frame
        ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
        Selectable(buf);
        if (IsItemHovered() && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, true, false);

        // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
        ImGuiListClipper clipper;
        clipper.Begin(pcmd->ElemCount / 3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
        while (clipper.Step())
            for (int prim = clipper.DisplayStart, idx_i = pcmd->IdxOffset + clipper.DisplayStart * 3; prim < clipper.DisplayEnd; prim++)
            {
                char* buf_p = buf, * buf_end = buf + IM_ARRAYSIZE(buf);
                ImVec2 triangle[3];
                for (int n = 0; n < 3; n++, idx_i++)
                {
                    const ImDrawVert& v = vtx_buffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                    triangle[n] = v.pos;
                    buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                        (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                }

                Selectable(buf, false);
                if (fg_draw_list && IsItemHovered())
                {
                    ImDrawListFlags backup_flags = fg_draw_list->Flags;
                    fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                    fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), ImDrawFlags_Closed, 1.0f);
                    fg_draw_list->Flags = backup_flags;
                }
            }
        TreePop();
    }
    TreePop();
}